

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_low_impl.h
# Opt level: O0

void secp256k1_scalar_cmov(secp256k1_scalar *r,secp256k1_scalar *a,int flag)

{
  unsigned_long _zzq_result;
  unsigned_long _zzq_args [6];
  int vflag;
  uint32_t mask1;
  uint32_t mask0;
  int flag_local;
  secp256k1_scalar *a_local;
  secp256k1_scalar *r_local;
  
  *r = *r & flag - 1U | *a & (flag - 1U ^ 0xffffffff);
  return;
}

Assistant:

static SECP256K1_INLINE void secp256k1_scalar_cmov(secp256k1_scalar *r, const secp256k1_scalar *a, int flag) {
    uint32_t mask0, mask1;
    volatile int vflag = flag;
    SECP256K1_CHECKMEM_CHECK_VERIFY(r, sizeof(*r));
    mask0 = vflag + ~((uint32_t)0);
    mask1 = ~mask0;
    *r = (*r & mask0) | (*a & mask1);
}